

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softmax.cpp
# Opt level: O2

int __thiscall ncnn::Softmax::forward_inplace(Softmax *this,Mat *bottom_top_blob,Option *opt)

{
  uint uVar1;
  uint uVar2;
  uint _h;
  size_t sVar3;
  size_t sVar4;
  void *pvVar5;
  int i_1;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  int i_2;
  int iVar10;
  int iVar11;
  ulong uVar12;
  void *pvVar13;
  ulong uVar14;
  int i_5;
  int iVar15;
  void *pvVar16;
  int j_4;
  int iVar17;
  ulong uVar18;
  int j_1;
  int j_7;
  long lVar19;
  int q;
  int i;
  long lVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  Mat sum;
  Mat max;
  Mat local_78;
  
  uVar1 = bottom_top_blob->dims;
  if (uVar1 == 1) {
    pvVar13 = bottom_top_blob->data;
    uVar6 = 0;
    uVar12 = (ulong)(uint)bottom_top_blob->w;
    if (bottom_top_blob->w < 1) {
      uVar12 = uVar6;
    }
    fVar22 = -3.4028235e+38;
    for (; uVar12 != uVar6; uVar6 = uVar6 + 1) {
      fVar23 = *(float *)((long)pvVar13 + uVar6 * 4);
      if (fVar22 <= fVar23) {
        fVar22 = fVar23;
      }
    }
    fVar23 = 0.0;
    for (uVar6 = 0; uVar12 != uVar6; uVar6 = uVar6 + 1) {
      fVar21 = expf(*(float *)((long)pvVar13 + uVar6 * 4) - fVar22);
      *(float *)((long)pvVar13 + uVar6 * 4) = fVar21;
      fVar23 = fVar23 + fVar21;
    }
    for (uVar6 = 0; uVar12 != uVar6; uVar6 = uVar6 + 1) {
      *(float *)((long)pvVar13 + uVar6 * 4) = *(float *)((long)pvVar13 + uVar6 * 4) * (1.0 / fVar23)
      ;
    }
    return 0;
  }
  sVar3 = bottom_top_blob->elemsize;
  iVar10 = (this->axis >> 0x1f & uVar1) + this->axis;
  if ((uVar1 == 2) && (iVar10 == 0)) {
    uVar1 = bottom_top_blob->w;
    uVar2 = bottom_top_blob->h;
    max.cstep = 0;
    max.data = (void *)0x0;
    max.refcount._0_4_ = 0;
    max.refcount._4_4_ = 0;
    max.elemsize._0_4_ = 0;
    max.elemsize._4_4_ = 0;
    max.elempack = 0;
    max.allocator = (Allocator *)0x0;
    max.dims = 0;
    max.w = 0;
    max.h = 0;
    max.d = 0;
    max.c = 0;
    Mat::create(&max,uVar1,sVar3,opt->workspace_allocator);
    iVar10 = -100;
    if ((max.data != (void *)0x0) && ((long)max.c * max.cstep != 0)) {
      Mat::fill(&max,-3.4028235e+38);
      iVar10 = bottom_top_blob->w;
      sVar4 = bottom_top_blob->elemsize;
      uVar12 = 0;
      uVar6 = 0;
      if (0 < (int)uVar1) {
        uVar6 = (ulong)uVar1;
      }
      pvVar13 = bottom_top_blob->data;
      uVar7 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar7 = uVar12;
      }
      for (; uVar12 != uVar7; uVar12 = uVar12 + 1) {
        for (uVar18 = 0; uVar6 != uVar18; uVar18 = uVar18 + 1) {
          fVar22 = *(float *)((long)pvVar13 + uVar18 * 4);
          fVar23 = *(float *)((long)max.data + uVar18 * 4);
          if (fVar22 <= fVar23) {
            fVar22 = fVar23;
          }
          *(float *)((long)max.data + uVar18 * 4) = fVar22;
        }
        pvVar13 = (void *)((long)pvVar13 + (long)iVar10 * sVar4);
      }
      sum.cstep = 0;
      sum.data = (void *)0x0;
      sum.refcount._0_4_ = 0;
      sum.refcount._4_4_ = 0;
      sum.elemsize._0_4_ = 0;
      sum.elemsize._4_4_ = 0;
      sum.elempack = 0;
      sum.allocator = (Allocator *)0x0;
      sum.dims = 0;
      sum.w = 0;
      sum.h = 0;
      sum.d = 0;
      sum.c = 0;
      Mat::create(&sum,uVar1,sVar3,opt->workspace_allocator);
      iVar10 = -100;
      if ((sum.data != (void *)0x0) && ((long)sum.c * sum.cstep != 0)) {
        Mat::fill(&sum,0.0);
        pvVar13 = bottom_top_blob->data;
        iVar10 = bottom_top_blob->w;
        sVar3 = bottom_top_blob->elemsize;
        for (uVar12 = 0; pvVar16 = max.data, pvVar5 = sum.data, uVar12 != uVar7; uVar12 = uVar12 + 1
            ) {
          for (uVar18 = 0; uVar6 != uVar18; uVar18 = uVar18 + 1) {
            fVar22 = expf(*(float *)((long)pvVar13 + uVar18 * 4) -
                          *(float *)((long)pvVar16 + uVar18 * 4));
            *(float *)((long)pvVar13 + uVar18 * 4) = fVar22;
            *(float *)((long)pvVar5 + uVar18 * 4) = fVar22 + *(float *)((long)pvVar5 + uVar18 * 4);
          }
          pvVar13 = (void *)((long)pvVar13 + (long)iVar10 * sVar3);
        }
        pvVar13 = bottom_top_blob->data;
        iVar17 = bottom_top_blob->w;
        sVar3 = bottom_top_blob->elemsize;
        iVar10 = 0;
        for (uVar12 = 0; uVar12 != uVar7; uVar12 = uVar12 + 1) {
          for (uVar18 = 0; uVar6 != uVar18; uVar18 = uVar18 + 1) {
            *(float *)((long)pvVar13 + uVar18 * 4) =
                 *(float *)((long)pvVar13 + uVar18 * 4) / *(float *)((long)sum.data + uVar18 * 4);
          }
          pvVar13 = (void *)((long)pvVar13 + (long)iVar17 * sVar3);
        }
      }
      Mat::~Mat(&sum);
    }
  }
  else {
    if ((uVar1 == 2) && (iVar10 == 1)) {
      uVar1 = bottom_top_blob->w;
      uVar12 = 0;
      if (0 < (int)uVar1) {
        uVar12 = (ulong)uVar1;
      }
      uVar2 = bottom_top_blob->h;
      if (bottom_top_blob->h < 1) {
        uVar2 = 0;
      }
      pvVar13 = bottom_top_blob->data;
      for (uVar6 = 0; uVar6 != uVar2; uVar6 = uVar6 + 1) {
        fVar22 = -3.4028235e+38;
        for (uVar7 = 0; uVar12 != uVar7; uVar7 = uVar7 + 1) {
          fVar23 = *(float *)((long)pvVar13 + uVar7 * 4);
          if (fVar22 <= fVar23) {
            fVar22 = fVar23;
          }
        }
        fVar23 = 0.0;
        for (uVar7 = 0; uVar12 != uVar7; uVar7 = uVar7 + 1) {
          fVar21 = expf(*(float *)((long)pvVar13 + uVar7 * 4) - fVar22);
          *(float *)((long)pvVar13 + uVar7 * 4) = fVar21;
          fVar23 = fVar23 + fVar21;
        }
        for (uVar7 = 0; uVar12 != uVar7; uVar7 = uVar7 + 1) {
          *(float *)((long)pvVar13 + uVar7 * 4) =
               *(float *)((long)pvVar13 + uVar7 * 4) * (1.0 / fVar23);
        }
        pvVar13 = (void *)((long)pvVar13 + sVar3 * (long)(int)uVar1);
      }
      return 0;
    }
    if ((uVar1 == 3) && (iVar10 == 0)) {
      iVar17 = bottom_top_blob->w;
      iVar11 = bottom_top_blob->h;
      iVar15 = bottom_top_blob->c;
      max.cstep = 0;
      max.data = (void *)0x0;
      max.refcount._0_4_ = 0;
      max.refcount._4_4_ = 0;
      max.elemsize._0_4_ = 0;
      max.elemsize._4_4_ = 0;
      max.elempack = 0;
      max.allocator = (Allocator *)0x0;
      max.dims = 0;
      max.w = 0;
      max.h = 0;
      max.d = 0;
      max.c = 0;
      Mat::create(&max,iVar17,iVar11,sVar3,opt->workspace_allocator);
      iVar10 = -100;
      if ((max.data == (void *)0x0) || ((long)max.c * max.cstep == 0)) goto LAB_001e84c0;
      Mat::fill(&max,-3.4028235e+38);
      uVar6 = 0;
      uVar12 = (ulong)(uint)(iVar11 * iVar17);
      if (iVar11 * iVar17 < 1) {
        uVar12 = uVar6;
      }
      if (iVar15 < 1) {
        iVar15 = 0;
      }
      while (iVar10 = (int)uVar6, iVar10 != iVar15) {
        Mat::channel(&sum,bottom_top_blob,iVar10);
        pvVar13 = sum.data;
        Mat::~Mat(&sum);
        for (uVar6 = 0; uVar12 != uVar6; uVar6 = uVar6 + 1) {
          fVar22 = *(float *)((long)pvVar13 + uVar6 * 4);
          fVar23 = *(float *)((long)max.data + uVar6 * 4);
          if (fVar22 <= fVar23) {
            fVar22 = fVar23;
          }
          *(float *)((long)max.data + uVar6 * 4) = fVar22;
        }
        uVar6 = (ulong)(iVar10 + 1);
      }
      sum.cstep = 0;
      sum.data = (void *)0x0;
      sum.refcount._0_4_ = 0;
      sum.refcount._4_4_ = 0;
      sum.elemsize._0_4_ = 0;
      sum.elemsize._4_4_ = 0;
      sum.elempack = 0;
      sum.allocator = (Allocator *)0x0;
      sum.dims = 0;
      sum.w = 0;
      sum.h = 0;
      sum.d = 0;
      sum.c = 0;
      Mat::create(&sum,iVar17,iVar11,sVar3,opt->workspace_allocator);
      iVar10 = -100;
      if ((sum.data != (void *)0x0) && ((long)sum.c * sum.cstep != 0)) {
        Mat::fill(&sum,0.0);
        for (iVar10 = 0; iVar10 != iVar15; iVar10 = iVar10 + 1) {
          Mat::channel(&local_78,bottom_top_blob,iVar10);
          pvVar16 = local_78.data;
          Mat::~Mat(&local_78);
          pvVar5 = max.data;
          pvVar13 = sum.data;
          for (uVar6 = 0; uVar12 != uVar6; uVar6 = uVar6 + 1) {
            fVar22 = expf(*(float *)((long)pvVar16 + uVar6 * 4) -
                          *(float *)((long)pvVar5 + uVar6 * 4));
            *(float *)((long)pvVar16 + uVar6 * 4) = fVar22;
            *(float *)((long)pvVar13 + uVar6 * 4) = fVar22 + *(float *)((long)pvVar13 + uVar6 * 4);
          }
        }
        iVar10 = 0;
        for (iVar17 = 0; iVar17 != iVar15; iVar17 = iVar17 + 1) {
          Mat::channel(&local_78,bottom_top_blob,iVar17);
          pvVar13 = local_78.data;
          Mat::~Mat(&local_78);
          for (uVar6 = 0; uVar12 != uVar6; uVar6 = uVar6 + 1) {
            *(float *)((long)pvVar13 + uVar6 * 4) =
                 *(float *)((long)pvVar13 + uVar6 * 4) / *(float *)((long)sum.data + uVar6 * 4);
          }
        }
      }
    }
    else {
      if ((uVar1 != 3) || (iVar10 != 1)) {
        if (uVar1 != 3) {
          return 0;
        }
        if (iVar10 == 2) {
          uVar1 = bottom_top_blob->w;
          uVar12 = 0;
          if (0 < (int)uVar1) {
            uVar12 = (ulong)uVar1;
          }
          iVar10 = bottom_top_blob->h;
          if (bottom_top_blob->h < 1) {
            iVar10 = 0;
          }
          iVar17 = bottom_top_blob->c;
          if (bottom_top_blob->c < 1) {
            iVar17 = 0;
          }
          for (iVar11 = 0; iVar11 != iVar17; iVar11 = iVar11 + 1) {
            Mat::channel(&max,bottom_top_blob,iVar11);
            pvVar13 = max.data;
            Mat::~Mat(&max);
            for (iVar15 = 0; iVar15 != iVar10; iVar15 = iVar15 + 1) {
              fVar22 = -3.4028235e+38;
              for (uVar6 = 0; uVar12 != uVar6; uVar6 = uVar6 + 1) {
                fVar23 = *(float *)((long)pvVar13 + uVar6 * 4);
                if (fVar22 <= fVar23) {
                  fVar22 = fVar23;
                }
              }
              fVar23 = 0.0;
              for (uVar6 = 0; uVar12 != uVar6; uVar6 = uVar6 + 1) {
                fVar21 = expf(*(float *)((long)pvVar13 + uVar6 * 4) - fVar22);
                *(float *)((long)pvVar13 + uVar6 * 4) = fVar21;
                fVar23 = fVar23 + fVar21;
              }
              for (uVar6 = 0; uVar12 != uVar6; uVar6 = uVar6 + 1) {
                *(float *)((long)pvVar13 + uVar6 * 4) =
                     *(float *)((long)pvVar13 + uVar6 * 4) * (1.0 / fVar23);
              }
              pvVar13 = (void *)((long)pvVar13 + (long)(int)uVar1 * 4);
            }
          }
          return 0;
        }
        return 0;
      }
      uVar1 = bottom_top_blob->w;
      uVar2 = bottom_top_blob->h;
      _h = bottom_top_blob->c;
      max.cstep = 0;
      max.data = (void *)0x0;
      max.refcount._0_4_ = 0;
      max.refcount._4_4_ = 0;
      max.elemsize._0_4_ = 0;
      max.elemsize._4_4_ = 0;
      max.elempack = 0;
      max.allocator = (Allocator *)0x0;
      max.dims = 0;
      max.w = 0;
      max.h = 0;
      max.d = 0;
      max.c = 0;
      Mat::create(&max,uVar1,_h,sVar3,opt->workspace_allocator);
      iVar10 = -100;
      if ((max.data == (void *)0x0) || ((long)max.c * max.cstep == 0)) goto LAB_001e84c0;
      Mat::fill(&max,-3.4028235e+38);
      uVar6 = 0;
      uVar12 = 0;
      if (0 < (int)uVar1) {
        uVar12 = (ulong)uVar1;
      }
      uVar7 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar7 = uVar6;
      }
      uVar18 = 0;
      if (0 < (int)_h) {
        uVar18 = (ulong)_h;
      }
      lVar19 = (long)(int)uVar1 * 4;
      for (; iVar17 = (int)uVar7, uVar6 != uVar18; uVar6 = uVar6 + 1) {
        Mat::channel(&sum,bottom_top_blob,(int)uVar6);
        pvVar13 = sum.data;
        Mat::~Mat(&sum);
        lVar8 = CONCAT44(max.elemsize._4_4_,(undefined4)max.elemsize) * uVar6 * (long)max.w;
        for (iVar10 = 0; iVar10 != iVar17; iVar10 = iVar10 + 1) {
          for (uVar14 = 0; uVar12 != uVar14; uVar14 = uVar14 + 1) {
            fVar22 = *(float *)((long)pvVar13 + uVar14 * 4);
            fVar23 = *(float *)((long)max.data + uVar14 * 4 + lVar8);
            if (fVar22 <= fVar23) {
              fVar22 = fVar23;
            }
            *(float *)((long)max.data + uVar14 * 4 + lVar8) = fVar22;
          }
          pvVar13 = (void *)((long)pvVar13 + lVar19);
        }
      }
      sum.cstep = 0;
      sum.data = (void *)0x0;
      sum.refcount._0_4_ = 0;
      sum.refcount._4_4_ = 0;
      sum.elemsize._0_4_ = 0;
      sum.elemsize._4_4_ = 0;
      sum.elempack = 0;
      sum.allocator = (Allocator *)0x0;
      sum.dims = 0;
      sum.w = 0;
      sum.h = 0;
      sum.d = 0;
      sum.c = 0;
      Mat::create(&sum,uVar1,_h,sVar3,opt->workspace_allocator);
      iVar10 = -100;
      if ((sum.data != (void *)0x0) && ((long)sum.c * sum.cstep != 0)) {
        Mat::fill(&sum,0.0);
        for (uVar6 = 0; uVar6 != uVar18; uVar6 = uVar6 + 1) {
          Mat::channel(&local_78,bottom_top_blob,(int)uVar6);
          pvVar16 = local_78.data;
          Mat::~Mat(&local_78);
          pvVar5 = max.data;
          pvVar13 = sum.data;
          lVar9 = (long)max.w;
          lVar20 = CONCAT44(sum.elemsize._4_4_,(undefined4)sum.elemsize) * uVar6 * (long)sum.w;
          lVar8 = CONCAT44(max.elemsize._4_4_,(undefined4)max.elemsize);
          for (iVar10 = 0; iVar10 != iVar17; iVar10 = iVar10 + 1) {
            for (uVar7 = 0; uVar12 != uVar7; uVar7 = uVar7 + 1) {
              fVar22 = expf(*(float *)((long)pvVar16 + uVar7 * 4) -
                            *(float *)((long)pvVar5 + uVar7 * 4 + lVar8 * uVar6 * lVar9));
              *(float *)((long)pvVar16 + uVar7 * 4) = fVar22;
              *(float *)((long)pvVar13 + uVar7 * 4 + lVar20) =
                   fVar22 + *(float *)((long)pvVar13 + uVar7 * 4 + lVar20);
            }
            pvVar16 = (void *)((long)pvVar16 + lVar19);
          }
        }
        iVar10 = 0;
        for (uVar6 = 0; uVar6 != uVar18; uVar6 = uVar6 + 1) {
          Mat::channel(&local_78,bottom_top_blob,(int)uVar6);
          pvVar13 = local_78.data;
          Mat::~Mat(&local_78);
          for (iVar11 = 0; iVar11 != iVar17; iVar11 = iVar11 + 1) {
            for (uVar7 = 0; uVar12 != uVar7; uVar7 = uVar7 + 1) {
              *(float *)((long)pvVar13 + uVar7 * 4) =
                   *(float *)((long)pvVar13 + uVar7 * 4) /
                   *(float *)((long)sum.data +
                             uVar7 * 4 +
                             CONCAT44(sum.elemsize._4_4_,(undefined4)sum.elemsize) * uVar6 *
                             (long)sum.w);
            }
            pvVar13 = (void *)((long)pvVar13 + lVar19);
          }
        }
      }
    }
    Mat::~Mat(&sum);
  }
LAB_001e84c0:
  Mat::~Mat(&max);
  return iVar10;
}

Assistant:

int Softmax::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    // value = exp( value - global max value )
    // sum all value
    // value = value / sum

    int dims = bottom_top_blob.dims;
    size_t elemsize = bottom_top_blob.elemsize;
    int positive_axis = axis < 0 ? dims + axis : axis;

    if (dims == 1) // positive_axis == 0
    {
        int w = bottom_top_blob.w;

        float* ptr = bottom_top_blob;

        float max = -FLT_MAX;
        for (int i = 0; i < w; i++)
        {
            max = std::max(max, ptr[i]);
        }

        float sum = 0.f;
        for (int i = 0; i < w; i++)
        {
            ptr[i] = static_cast<float>(exp(ptr[i] - max));
            sum += ptr[i];
        }

        for (int i = 0; i < w; i++)
        {
            ptr[i] /= sum;
        }

        return 0;
    }

    if (dims == 2 && positive_axis == 0)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;

        Mat max;
        max.create(w, elemsize, opt.workspace_allocator);
        if (max.empty())
            return -100;
        max.fill(-FLT_MAX);

        for (int i = 0; i < h; i++)
        {
            const float* ptr = bottom_top_blob.row(i);
            for (int j = 0; j < w; j++)
            {
                max[j] = std::max(max[j], ptr[j]);
            }
        }

        Mat sum;
        sum.create(w, elemsize, opt.workspace_allocator);
        if (sum.empty())
            return -100;
        sum.fill(0.f);

        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            for (int j = 0; j < w; j++)
            {
                ptr[j] = static_cast<float>(exp(ptr[j] - max[j]));
                sum[j] += ptr[j];
            }
        }

        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            for (int j = 0; j < w; j++)
            {
                ptr[j] /= sum[j];
            }
        }

        return 0;
    }

    if (dims == 2 && positive_axis == 1)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;

        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            float m = -FLT_MAX;
            for (int j = 0; j < w; j++)
            {
                m = std::max(m, ptr[j]);
            }

            float s = 0.f;
            for (int j = 0; j < w; j++)
            {
                ptr[j] = static_cast<float>(exp(ptr[j] - m));
                s += ptr[j];
            }

            for (int j = 0; j < w; j++)
            {
                ptr[j] /= s;
            }
        }

        return 0;
    }

    if (dims == 3 && positive_axis == 0)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;
        int size = w * h;

        Mat max;
        max.create(w, h, elemsize, opt.workspace_allocator);
        if (max.empty())
            return -100;
        max.fill(-FLT_MAX);
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                max[i] = std::max(max[i], ptr[i]);
            }
        }

        Mat sum;
        sum.create(w, h, elemsize, opt.workspace_allocator);
        if (sum.empty())
            return -100;
        sum.fill(0.f);
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                ptr[i] = static_cast<float>(exp(ptr[i] - max[i]));
                sum[i] += ptr[i];
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                ptr[i] /= sum[i];
            }
        }

        return 0;
    }

    if (dims == 3 && positive_axis == 1)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;

        Mat max;
        max.create(w, channels, elemsize, opt.workspace_allocator);
        if (max.empty())
            return -100;
        max.fill(-FLT_MAX);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_top_blob.channel(q);
            float* maxptr = max.row(q);

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
                    maxptr[j] = std::max(maxptr[j], ptr[j]);
                }

                ptr += w;
            }
        }

        Mat sum;
        sum.create(w, channels, elemsize, opt.workspace_allocator);
        if (sum.empty())
            return -100;
        sum.fill(0.f);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            float* maxptr = max.row(q);
            float* sumptr = sum.row(q);

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
                    ptr[j] = static_cast<float>(exp(ptr[j] - maxptr[j]));
                    sumptr[j] += ptr[j];
                }

                ptr += w;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            float* sumptr = sum.row(q);

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
                    ptr[j] /= sumptr[j];
                }

                ptr += w;
            }
        }

        return 0;
    }

    if (dims == 3 && positive_axis == 2)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < h; i++)
            {
                float max = -FLT_MAX;
                for (int j = 0; j < w; j++)
                {
                    max = std::max(max, ptr[j]);
                }

                float sum = 0.f;
                for (int j = 0; j < w; j++)
                {
                    ptr[j] = static_cast<float>(exp(ptr[j] - max));
                    sum += ptr[j];
                }

                for (int j = 0; j < w; j++)
                {
                    ptr[j] /= sum;
                }

                ptr += w;
            }
        }

        return 0;
    }

    return 0;
}